

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_gsub(lua_State *L)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  lua_State *L_00;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *e;
  char *pcVar9;
  void *pvVar10;
  size_t l_00;
  lua_Integer n;
  ulong uVar11;
  char *s;
  size_t l;
  size_t lp;
  size_t srcl;
  luaL_Buffer b;
  MatchState ms;
  uint local_6d4;
  char *local_6c0;
  size_t local_6b8;
  ulong local_6b0;
  char *local_6a8;
  lua_State *local_6a0;
  lua_Integer local_698;
  size_t local_690;
  size_t local_688;
  char *local_680;
  luaL_Buffer local_678;
  MatchState local_258;
  
  pcVar7 = luaL_checklstring(L,1,&local_688);
  pcVar8 = luaL_checklstring(L,2,&local_6b8);
  uVar5 = lua_type(L,3);
  uVar11 = (ulong)uVar5;
  local_698 = luaL_optinteger(L,4,local_688 + 1);
  cVar1 = *pcVar8;
  if (3 < uVar5 - 3) {
    luaL_typeerror(L,3,"string/function/table");
  }
  luaL_buffinit(L,&local_678);
  if (cVar1 == '^') {
    pcVar8 = pcVar8 + 1;
    local_6b8 = local_6b8 - 1;
  }
  local_258.matchdepth = 200;
  local_258.src_end = pcVar7 + local_688;
  local_258.p_end = pcVar8 + local_6b8;
  pcVar9 = (char *)0x0;
  n = 0;
  local_6d4 = 0;
  local_6b0 = uVar11;
  local_6a8 = pcVar8;
  local_258.src_init = pcVar7;
  local_258.L = L;
  do {
    if (local_698 <= n) break;
    local_258.level = '\0';
    e = match(&local_258,pcVar7,pcVar8);
    L_00 = local_258.L;
    bVar4 = cVar1 != '^';
    if (e == pcVar9 || e == (char *)0x0) {
      if (pcVar7 < local_258.src_end) {
        if (local_678.size <= local_678.n) {
          luaL_prepbuffsize(&local_678,1);
        }
        cVar2 = *pcVar7;
        pcVar7 = pcVar7 + 1;
        local_678.b[local_678.n] = cVar2;
        local_678.n = local_678.n + 1;
      }
      else {
        bVar4 = false;
      }
    }
    else {
      if ((int)uVar11 == 5) {
        push_onecapture(&local_258,0,pcVar7,e);
        lua_gettable(L_00,3);
LAB_0014cf88:
        iVar6 = lua_toboolean(L_00,-1);
        if (iVar6 == 0) {
          lua_settop(L_00,-2);
          luaL_addlstring(&local_678,pcVar7,(long)e - (long)pcVar7);
          uVar5 = 0;
        }
        else {
          iVar6 = lua_isstring(L_00,-1);
          if (iVar6 == 0) {
            iVar6 = lua_type(L_00,-1);
            pcVar7 = lua_typename(L_00,iVar6);
            uVar5 = luaL_error(L_00,"invalid replacement value (a %s)",pcVar7);
          }
          else {
            luaL_addvalue(&local_678);
            uVar5 = 1;
          }
        }
      }
      else {
        if ((int)uVar11 == 6) {
          lua_pushvalue(local_258.L,3);
          iVar6 = push_captures(&local_258,pcVar7,e);
          lua_callk(L_00,iVar6,1,0,(lua_KFunction)0x0);
          goto LAB_0014cf88;
        }
        local_6a0 = local_258.L;
        pcVar9 = lua_tolstring(local_258.L,3,(size_t *)&local_6c0);
        pcVar8 = local_6c0;
        pvVar10 = memchr(pcVar9,0x25,(size_t)local_6c0);
        if (pvVar10 != (void *)0x0) {
          local_690 = (long)e - (long)pcVar7;
          s = pcVar9;
          do {
            luaL_addlstring(&local_678,s,(long)pvVar10 - (long)s);
            bVar3 = *(byte *)((long)pvVar10 + 1);
            l_00 = local_690;
            pcVar8 = pcVar7;
            if (bVar3 == 0x30) {
LAB_0014d076:
              luaL_addlstring(&local_678,pcVar8,l_00);
            }
            else if (bVar3 == 0x25) {
              if (local_678.size <= local_678.n) {
                luaL_prepbuffsize(&local_678,1);
              }
              local_678.b[local_678.n] = *(char *)((long)pvVar10 + 1);
              local_678.n = local_678.n + 1;
            }
            else if (bVar3 - 0x30 < 10) {
              l_00 = get_onecapture(&local_258,(char)bVar3 + -0x31,pcVar7,e,&local_680);
              pcVar8 = local_680;
              if (l_00 != 0xfffffffffffffffe) goto LAB_0014d076;
              luaL_addvalue(&local_678);
            }
            else {
              luaL_error(local_6a0,"invalid use of \'%c\' in replacement string",0x25);
            }
            pcVar9 = (char *)((long)pvVar10 + 2);
            pcVar8 = s + ((long)local_6c0 - (long)pcVar9);
            local_6c0 = pcVar8;
            pvVar10 = memchr(pcVar9,0x25,(size_t)pcVar8);
            s = pcVar9;
          } while (pvVar10 != (void *)0x0);
        }
        luaL_addlstring(&local_678,pcVar9,(size_t)pcVar8);
        uVar5 = 1;
        uVar11 = local_6b0;
        pcVar8 = local_6a8;
      }
      n = n + 1;
      local_6d4 = local_6d4 | uVar5;
      pcVar9 = e;
      pcVar7 = e;
    }
  } while (bVar4);
  if (local_6d4 == 0) {
    lua_pushvalue(L,1);
  }
  else {
    luaL_addlstring(&local_678,pcVar7,(long)local_258.src_end - (long)pcVar7);
    luaL_pushresult(&local_678);
  }
  lua_pushinteger(L,n);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl, lp;
  const char *src = luaL_checklstring(L, 1, &srcl);  /* subject */
  const char *p = luaL_checklstring(L, 2, &lp);  /* pattern */
  const char *lastmatch = NULL;  /* end of last match */
  int tr = lua_type(L, 3);  /* replacement type */
  lua_Integer max_s = luaL_optinteger(L, 4, srcl + 1);  /* max replacements */
  int anchor = (*p == '^');
  lua_Integer n = 0;  /* replacement count */
  int changed = 0;  /* change flag */
  MatchState ms;
  luaL_Buffer b;
  luaL_argexpected(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table");
  luaL_buffinit(L, &b);
  if (anchor) {
    p++; lp--;  /* skip anchor character */
  }
  prepstate(&ms, L, src, srcl, p, lp);
  while (n < max_s) {
    const char *e;
    reprepstate(&ms);  /* (re)prepare state for new match */
    if ((e = match(&ms, src, p)) != NULL && e != lastmatch) {  /* match? */
      n++;
      changed = add_value(&ms, &b, src, e, tr) | changed;
      src = lastmatch = e;
    }
    else if (src < ms.src_end)  /* otherwise, skip one character */
      luaL_addchar(&b, *src++);
    else break;  /* end of subject */
    if (anchor) break;
  }
  if (!changed)  /* no changes? */
    lua_pushvalue(L, 1);  /* return original string */
  else {  /* something changed */
    luaL_addlstring(&b, src, ms.src_end-src);
    luaL_pushresult(&b);  /* create and return new string */
  }
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}